

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

bool __thiscall
cmFileListGeneratorCaseInsensitive::Search
          (cmFileListGeneratorCaseInsensitive *this,string *parent,cmFileList *lister)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  char *local_68;
  char *fname;
  unsigned_long i;
  Directory local_48;
  Directory d;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  matches;
  cmFileList *lister_local;
  string *parent_local;
  cmFileListGeneratorCaseInsensitive *this_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&d);
  cmsys::Directory::Directory(&local_48);
  cmsys::Directory::Load(&local_48,parent);
  fname = (char *)0x0;
  do {
    pcVar1 = fname;
    pcVar4 = (char *)cmsys::Directory::GetNumberOfFiles(&local_48);
    if (pcVar4 <= pcVar1) {
      this_local._7_1_ = false;
LAB_0060d90e:
      cmsys::Directory::~Directory(&local_48);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&d);
      return this_local._7_1_;
    }
    local_68 = cmsys::Directory::GetFile(&local_48,(unsigned_long)fname);
    iVar3 = strcmp(local_68,".");
    if ((iVar3 != 0) && (iVar3 = strcmp(local_68,".."), pcVar1 = local_68, iVar3 != 0)) {
      pcVar4 = (char *)std::__cxx11::string::c_str();
      iVar3 = cmsysString_strcasecmp(pcVar1,pcVar4);
      if (iVar3 == 0) {
        std::operator+(&local_88,parent,local_68);
        bVar2 = cmFileListGeneratorBase::Consider
                          (&this->super_cmFileListGeneratorBase,&local_88,lister);
        std::__cxx11::string::~string((string *)&local_88);
        if (bVar2) {
          this_local._7_1_ = true;
          goto LAB_0060d90e;
        }
      }
    }
    fname = fname + 1;
  } while( true );
}

Assistant:

bool Search(std::string const& parent, cmFileList& lister) CM_OVERRIDE
  {
    // Look for matching files.
    std::vector<std::string> matches;
    cmsys::Directory d;
    d.Load(parent);
    for (unsigned long i = 0; i < d.GetNumberOfFiles(); ++i) {
      const char* fname = d.GetFile(i);
      if (strcmp(fname, ".") == 0 || strcmp(fname, "..") == 0) {
        continue;
      }
      if (cmsysString_strcasecmp(fname, this->String.c_str()) == 0) {
        if (this->Consider(parent + fname, lister)) {
          return true;
        }
      }
    }
    return false;
  }